

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compress_usingDict
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  int compressionLevel_00;
  ZSTD_parameters params;
  
  sVar1 = dictSize;
  if (dict == (void *)0x0) {
    sVar1 = 0;
  }
  ZSTD_getCParams_internal(&params.cParams,compressionLevel,srcSize,sVar1,ZSTD_cpm_noAttachDict);
  params.fParams.checksumFlag = 0;
  params.fParams.noDictIDFlag = 0;
  params.fParams.contentSizeFlag = 1;
  compressionLevel_00 = 3;
  if (compressionLevel != 0) {
    compressionLevel_00 = compressionLevel;
  }
  ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams,&params,compressionLevel_00);
  sVar1 = ZSTD_compress_advanced_internal
                    (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&cctx->simpleApiParams);
  return sVar1;
}

Assistant:

size_t ZSTD_compress_usingDict(ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict, size_t dictSize,
                               int compressionLevel)
{
    {
        ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, srcSize, dict ? dictSize : 0, ZSTD_cpm_noAttachDict);
        assert(params.fParams.contentSizeFlag == 1);
        ZSTD_CCtxParams_init_internal(&cctx->simpleApiParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT: compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compress_usingDict (srcSize=%u)", (unsigned)srcSize);
    return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, dict, dictSize, &cctx->simpleApiParams);
}